

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTests.cpp
# Opt level: O3

void testExpect(TokenKind kind)

{
  Token lastConsumed;
  Token matchingDelim;
  TokenKind expected;
  bool bVar1;
  SourceLocation SVar2;
  long lVar3;
  TokenKind in_DI;
  Diagnostic *__location;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar4;
  string_view sVar5;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  AssertionHandler catchAssertionHandler;
  Token token;
  Token actual;
  TokenKind local_12a;
  AssertionHandler local_128;
  Token local_e0;
  ITransientExpression local_d0;
  Token *local_c0;
  char *local_b8;
  undefined8 local_b0;
  TokenKind *local_a8;
  undefined8 local_a0;
  char *pcStack_98;
  Token local_90;
  Token local_80;
  Token local_70;
  ITransientExpression local_60;
  ITransientExpression local_50;
  ITransientExpression local_40;
  
  local_12a = in_DI;
  if (DAT_00cb2828 != 0) {
    lVar3 = DAT_00cb2828 * 0x70;
    __location = slang::diagnostics;
    do {
      std::ranges::__destroy_at_fn::operator()<slang::Diagnostic>
                ((__destroy_at_fn *)&std::ranges::destroy_at,__location);
      __location = __location + 1;
      lVar3 = lVar3 + -0x70;
    } while (lVar3 != 0);
  }
  DAT_00cb2828 = 0;
  local_a0 = 3;
  pcStack_98 = "SDF";
  sVar5._M_str = "SDF";
  sVar5._M_len = 3;
  slang::parsing::Token::Token
            (&local_70,(BumpAllocator *)slang::alloc,Identifier,
             (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),sVar5,
             (SourceLocation)0x50000001);
  expected = local_12a;
  slang::parsing::Token::Token(&local_80);
  slang::parsing::Token::Token(&local_90);
  lastConsumed.info = local_80.info;
  lastConsumed.kind = local_80.kind;
  lastConsumed._2_1_ = local_80._2_1_;
  lastConsumed.numFlags.raw = local_80.numFlags.raw;
  lastConsumed.rawLen = local_80.rawLen;
  matchingDelim.info = local_90.info;
  matchingDelim.kind = local_90.kind;
  matchingDelim._2_1_ = local_90._2_1_;
  matchingDelim.numFlags.raw = local_90.numFlags.raw;
  matchingDelim.rawLen = local_90.rawLen;
  local_e0 = slang::parsing::Token::createExpected
                       ((BumpAllocator *)slang::alloc,(Diagnostics *)&slang::diagnostics,local_70,
                        expected,lastConsumed,matchingDelim);
  local_d0._vptr_ITransientExpression = (_func_int **)0x9daa60;
  local_d0.m_isBinaryExpression = true;
  local_d0.m_result = true;
  local_d0._10_6_ = 0;
  capturedExpression.m_size = 0x12;
  capturedExpression.m_start = "token.kind == kind";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_128,macroName,(SourceLineInfo *)&local_d0,capturedExpression,ContinueOnFailure);
  local_a8 = &local_12a;
  local_d0.m_result = local_e0.kind == local_12a;
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c8bc78;
  local_b8 = "==";
  local_b0 = 2;
  local_c0 = &local_e0;
  Catch::AssertionHandler::handleExpr(&local_128,&local_d0);
  Catch::AssertionHandler::complete(&local_128);
  if (local_128.m_completed == false) {
    (*(local_128.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_d0._vptr_ITransientExpression = (_func_int **)0x9daa60;
  local_d0.m_isBinaryExpression = true;
  local_d0.m_result = true;
  local_d0._10_6_ = 0;
  capturedExpression_00.m_size = 0x16;
  capturedExpression_00.m_start = "token.trivia().empty()";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_128,macroName_00,(SourceLineInfo *)&local_d0,capturedExpression_00,
             ContinueOnFailure);
  sVar4 = slang::parsing::Token::trivia(&local_e0);
  local_60.m_result = sVar4._M_extent._M_extent_value._M_extent_value == 0;
  local_60.m_isBinaryExpression = false;
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c896a0;
  local_60._10_1_ = local_60.m_result;
  Catch::AssertionHandler::handleExpr(&local_128,&local_60);
  Catch::AssertionHandler::complete(&local_128);
  if (local_128.m_completed == false) {
    (*(local_128.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_d0._vptr_ITransientExpression = (_func_int **)0x9daa60;
  local_d0.m_isBinaryExpression = true;
  local_d0.m_result = true;
  local_d0._10_6_ = 0;
  capturedExpression_01.m_size = 0x1e;
  capturedExpression_01.m_start = "token.location().offset() == 5";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_128,macroName_01,(SourceLineInfo *)&local_d0,capturedExpression_01,
             ContinueOnFailure);
  SVar2 = slang::parsing::Token::location(&local_e0);
  local_c0 = (Token *)((ulong)SVar2 >> 0x1c);
  local_d0.m_result = local_c0 == (Token *)0x5;
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c89420;
  local_b8 = "==";
  local_b0 = 2;
  local_a8 = (TokenKind *)CONCAT44(local_a8._4_4_,5);
  Catch::AssertionHandler::handleExpr(&local_128,&local_d0);
  Catch::AssertionHandler::complete(&local_128);
  if (local_128.m_completed == false) {
    (*(local_128.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_d0._vptr_ITransientExpression = (_func_int **)0x9daa60;
  local_d0.m_isBinaryExpression = true;
  local_d0.m_result = true;
  local_d0._10_6_ = 0;
  capturedExpression_02.m_size = 0x11;
  capturedExpression_02.m_start = "token.isMissing()";
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_128,macroName_02,(SourceLineInfo *)&local_d0,capturedExpression_02,
             ContinueOnFailure);
  local_50.m_result = (bool)(local_e0._2_1_ & 1);
  local_50.m_isBinaryExpression = false;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c896a0;
  local_50._10_1_ = local_50.m_result;
  Catch::AssertionHandler::handleExpr(&local_128,&local_50);
  Catch::AssertionHandler::complete(&local_128);
  if (local_128.m_completed == false) {
    (*(local_128.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  bVar1 = slang::parsing::LexerFacts::isKeyword(local_12a);
  if (!bVar1) {
    local_d0._vptr_ITransientExpression = (_func_int **)0x9daa60;
    local_d0.m_isBinaryExpression = true;
    local_d0.m_result = true;
    local_d0._10_6_ = 0;
    capturedExpression_03.m_size = 0x19;
    capturedExpression_03.m_start = "token.valueText().empty()";
    macroName_03.m_size = 5;
    macroName_03.m_start = "CHECK";
    Catch::AssertionHandler::AssertionHandler
              (&local_128,macroName_03,(SourceLineInfo *)&local_d0,capturedExpression_03,
               ContinueOnFailure);
    sVar5 = slang::parsing::Token::valueText(&local_e0);
    local_40.m_result = sVar5._M_len == 0;
    local_40.m_isBinaryExpression = false;
    local_40._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c896a0;
    local_40._10_1_ = local_40.m_result;
    Catch::AssertionHandler::handleExpr(&local_128,&local_40);
    Catch::AssertionHandler::complete(&local_128);
    if (local_128.m_completed == false) {
      (*(local_128.m_resultCapture)->_vptr_IResultCapture[0x14])();
    }
    local_d0._vptr_ITransientExpression = (_func_int **)0x9daa60;
    local_d0.m_isBinaryExpression = true;
    local_d0.m_result = true;
    local_d0._10_6_ = 0;
    capturedExpression_04.m_size = 0x17;
    capturedExpression_04.m_start = "token.rawText().empty()";
    macroName_04.m_size = 5;
    macroName_04.m_start = "CHECK";
    Catch::AssertionHandler::AssertionHandler
              (&local_128,macroName_04,(SourceLineInfo *)&local_d0,capturedExpression_04,
               ContinueOnFailure);
    sVar5 = slang::parsing::Token::rawText(&local_e0);
    bVar1 = sVar5._M_len == 0;
    local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c896a0;
    local_d0._8_8_ = (ulong)CONCAT52(local_d0._11_5_,CONCAT11(bVar1,bVar1)) << 8;
    Catch::AssertionHandler::handleExpr(&local_128,&local_d0);
    Catch::AssertionHandler::complete(&local_128);
    if (local_128.m_completed == false) {
      (*(local_128.m_resultCapture)->_vptr_IResultCapture[0x14])();
    }
  }
  return;
}

Assistant:

void testExpect(TokenKind kind) {
    diagnostics.clear();
    Token actual(alloc, TokenKind::Identifier, {}, "SDF", SourceLocation(BufferID(1, "asdf"), 5));
    Token token = Token::createExpected(alloc, diagnostics, actual, kind, Token(), Token());

    CHECK(token.kind == kind);
    CHECK(token.trivia().empty());
    CHECK(token.location().offset() == 5);
    CHECK(token.isMissing());

    if (!LF::isKeyword(kind)) {
        CHECK(token.valueText().empty());
        CHECK(token.rawText().empty());
    }
}